

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expLabelFuncOrga(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters
                )

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *this;
  element_type *this_00;
  Identifier *args_1;
  __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  int64_t iVar3;
  Identifier *in_RCX;
  Label *label;
  vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters_local;
  Identifier *funcName_local;
  
  sVar2 = std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::size
                    (parameters);
  if (sVar2 == 0) {
    bVar1 = FileManager::hasOpenFile(g_fileManager);
    if (bVar1) {
      iVar3 = FileManager::getPhysicalAddress(g_fileManager);
      ExpressionValue::ExpressionValue(__return_storage_ptr__,iVar3);
    }
    else {
      Logger::queueError<Identifier>((Logger *)0x1,0x220855,(char *)funcName,in_RCX);
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
  }
  else {
    this = &std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::front
                      (parameters)->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>;
    this_00 = std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::get(this);
    if (this_00 == (element_type *)0x0) {
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
    else {
      bVar1 = Label::hasPhysicalValue(this_00);
      if (bVar1) {
        this_01 = (__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::
                  front(parameters);
        this_02 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_01);
        iVar3 = Label::getPhysicalValue(this_02);
        ExpressionValue::ExpressionValue(__return_storage_ptr__,iVar3);
      }
      else {
        args_1 = Label::getName(this_00);
        Logger::queueError<Identifier,Identifier>
                  (Error,"%s: parameter %s has no physical address",funcName,args_1);
        ExpressionValue::ExpressionValue(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expLabelFuncOrga(const Identifier &funcName, const std::vector<std::shared_ptr<Label>>& parameters)
{
	// return physical address of label parameter
	if (parameters.size())
	{
		Label* label = parameters.front().get();
		if (!label)
			return ExpressionValue();

		if (!label->hasPhysicalValue())
		{
			Logger::queueError(Logger::Error, "%s: parameter %s has no physical address", funcName, label->getName());
			return ExpressionValue();
		}

		return ExpressionValue(parameters.front()->getPhysicalValue());
	}

	// return current physical address otherwise
	if(!g_fileManager->hasOpenFile())
	{
		Logger::queueError(Logger::Error, "%s: no file opened", funcName);
		return ExpressionValue();
	}
	return ExpressionValue(g_fileManager->getPhysicalAddress());
}